

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
immutable::rrb_details::create_concat_plan<char,false,5>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          rrb_details *this,ref<immutable::rrb_details::internal_node<char,_false>_> *all,
          uint32_t *top_len)

{
  uint32_t uVar1;
  uint uVar2;
  pointer puVar3;
  internal_node<char,_false> *piVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint32_t i;
  ulong uVar12;
  allocator_type local_31;
  
  piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                     ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(ulong)piVar4->len,&local_31);
  lVar11 = 0;
  uVar12 = 0;
  iVar7 = 0;
  while( true ) {
    piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this);
    if (piVar4->len <= uVar12) break;
    piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this);
    piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                        ((long)&piVar4->child->ptr + lVar11));
    uVar1 = piVar4->len;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_start[uVar12] = uVar1;
    iVar7 = iVar7 + uVar1;
    uVar12 = uVar12 + 1;
    lVar11 = lVar11 + 8;
  }
  piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                     ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this);
  uVar2 = piVar4->len;
  uVar8 = (iVar7 - 1U >> 5) + 3;
  puVar3 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = 0;
  uVar12 = (ulong)uVar2;
  while (uVar8 < (uint)uVar12) {
    do {
      uVar10 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
      uVar9 = puVar3[uVar10];
    } while (0x1f < uVar9);
    do {
      uVar6 = uVar5;
      uVar9 = uVar9 + puVar3[uVar6];
      uVar5 = 0x20;
      if (uVar9 < 0x20) {
        uVar5 = uVar9;
      }
      puVar3[uVar6 - 1] = uVar5;
      uVar9 = uVar9 - uVar5;
      uVar5 = uVar6 + 1;
    } while (uVar9 != 0);
    uVar12 = (ulong)((uint)uVar12 - 1);
    uVar5 = uVar6 - 1;
    for (uVar10 = (ulong)uVar6; uVar10 < uVar12; uVar10 = uVar10 + 1) {
      puVar3[uVar10] = puVar3[uVar10 + 1];
    }
  }
  if (uVar2 < uVar8) {
    uVar8 = uVar2;
  }
  *(uint *)&all->ptr = uVar8;
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<uint32_t> create_concat_plan(const ref<internal_node<T, atomic_ref_counting>>& all, uint32_t* top_len)
      {
      std::vector<uint32_t> node_count(all->len);

      uint32_t total_nodes = 0;
      for (uint32_t i = 0; i < all->len; i++)
        {
        const uint32_t size = all->child[i]->len;
        node_count[i] = size;
        total_nodes += size;
        }

      const uint32_t optimal_slots = ((total_nodes - 1) / bits<N>::rrb_branching) + 1;

      uint32_t shuffled_len = all->len;
      uint32_t i = 0;
      while (optimal_slots + bits<N>::rrb_extras < shuffled_len)
        {

        // Skip over all nodes satisfying the invariant.
        while (node_count[i] > bits<N>::rrb_branching - bits<N>::rrb_invariant)
          {
          i++;
          }

        // Found short node, so redistribute over the next nodes
        uint32_t remaining_nodes = node_count[i];
        do
          {
          const uint32_t min_size = std::min<uint32_t>(remaining_nodes + node_count[i + 1], bits<N>::rrb_branching);
          node_count[i] = min_size;
          remaining_nodes = remaining_nodes + node_count[i + 1] - min_size;
          i++;
          } while (remaining_nodes > 0);

          // Shuffle up remaining node sizes
          for (uint32_t j = i; j < shuffled_len - 1; j++)
            {
            node_count[j] = node_count[j + 1]; // Could use memmove here I guess
            }
          shuffled_len--;
          i--;
        }

      *top_len = shuffled_len;
      return node_count;
      }